

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O0

void dtl_json_reader_close(void *arg)

{
  uint uVar1;
  uint8_t *puVar2;
  uint8_t *pEnd_00;
  uint8_t *pResult;
  uint8_t *pEnd;
  uint8_t *pBegin;
  dtl_json_reader_t *self;
  void *arg_local;
  
  if (arg != (void *)0x0) {
    puVar2 = (uint8_t *)adt_bytearray_data((long)arg + 0x20);
    uVar1 = adt_bytearray_length((long)arg + 0x20);
    pEnd_00 = puVar2 + uVar1;
    if (((puVar2 != (uint8_t *)0x0) && (pEnd_00 != (uint8_t *)0x0)) &&
       (puVar2 = dtl_json_reader_parse_block((dtl_json_reader_t *)arg,puVar2,pEnd_00),
       puVar2 == pEnd_00)) {
      *(undefined1 *)((long)arg + 0x49) = 1;
    }
  }
  return;
}

Assistant:

static void dtl_json_reader_close(void *arg)
{
   dtl_json_reader_t *self = (dtl_json_reader_t*) arg;
   if (self != 0)
   {
      const uint8_t *pBegin;
      const uint8_t *pEnd;
      pBegin = adt_bytearray_data(&self->parseBuf);
      pEnd = pBegin + adt_bytearray_length(&self->parseBuf);
      if ( (pBegin != 0) && (pEnd != 0) )
      {
         const uint8_t *pResult = dtl_json_reader_parse_block(self, pBegin, pEnd);
         if (pResult == pEnd)
         {
            self->parseComplete = true;
         }
      }
   }
}